

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcContext.cpp
# Opt level: O1

void __thiscall
deqp::Context::createRenderContext(Context *this,ContextType *contextType,ContextFlags ctxFlags)

{
  RunMode RVar1;
  int iVar2;
  RenderContext *context;
  ContextInfo *pCVar3;
  undefined4 extraout_var;
  RenderConfig renderCfg;
  RenderConfig local_40;
  
  local_40.type.super_ApiType.m_bits =
       (ApiType)((contextType->super_ApiType).m_bits & 0x1fff | ctxFlags << 10);
  local_40.width = -1;
  local_40.height = -1;
  local_40.surfaceType = SURFACETYPE_DONT_CARE;
  local_40.windowVisibility = VISIBILITY_VISIBLE;
  local_40.id = -1;
  local_40.redBits = -1;
  local_40.greenBits = -1;
  local_40.blueBits = -1;
  local_40.alphaBits = -1;
  local_40.depthBits = -1;
  local_40.stencilBits = -1;
  local_40.numSamples = -1;
  local_40.resetNotificationStrategy = RESET_NOTIFICATION_STRATEGY_NOT_SPECIFIED;
  glu::parseRenderConfig(&local_40,this->m_testCtx->m_cmdLine);
  RVar1 = tcu::CommandLine::getRunMode(this->m_testCtx->m_cmdLine);
  if (RVar1 != RUNMODE_EXECUTE) {
    local_40.surfaceType = SURFACETYPE_OFFSCREEN_GENERIC;
  }
  context = glu::createRenderContext
                      (this->m_testCtx->m_platform,this->m_testCtx->m_cmdLine,&local_40);
  this->m_renderCtx = context;
  pCVar3 = glu::ContextInfo::create(context);
  this->m_contextInfo = pCVar3;
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  glw::setCurrentThreadFunctions((Functions *)CONCAT44(extraout_var,iVar2));
  return;
}

Assistant:

void Context::createRenderContext(glu::ContextType& contextType, glu::ContextFlags ctxFlags)
{
	DE_ASSERT(!m_renderCtx && !m_contextInfo);

	try
	{
		glu::RenderConfig renderCfg(glu::ContextType(contextType.getAPI(), contextType.getFlags() | ctxFlags));

		glu::parseRenderConfig(&renderCfg, m_testCtx.getCommandLine());

		if (m_testCtx.getCommandLine().getRunMode() != tcu::RUNMODE_EXECUTE)
		{
			// \todo [2016-11-16 pyry] Create DummyRenderContext instead to allow generating all case lists
			//						   on a system that doesn't support some GL(ES) versions.
			renderCfg.surfaceType = glu::RenderConfig::SURFACETYPE_OFFSCREEN_GENERIC;
		}

		m_renderCtx   = glu::createRenderContext(m_testCtx.getPlatform(), m_testCtx.getCommandLine(), renderCfg);
		m_contextInfo = glu::ContextInfo::create(*m_renderCtx);

		glw::setCurrentThreadFunctions(&m_renderCtx->getFunctions());
	}
	catch (...)
	{
		destroyRenderContext();
		throw;
	}
}